

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O2

void __thiscall
spvtools::anon_unknown_0::Disassembler::Disassembler
          (Disassembler *this,AssemblyGrammar *grammar,uint32_t options,NameMapper *name_mapper)

{
  stringstream *psVar1;
  ostream *stream;
  bool bVar2;
  _Any_data local_50;
  code *local_40;
  
  this->print_ = (bool)((byte)options >> 1 & 1);
  this->nested_indent_ = (bool)((byte)(options >> 8) & 1);
  this->reorder_blocks_ = (bool)((byte)(options >> 9) & 1);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->text_);
  bVar2 = this->print_ == false;
  psVar1 = (stringstream *)0x0;
  if (bVar2) {
    psVar1 = &this->text_;
  }
  (this->out_).pStream = psVar1;
  if (bVar2) {
    stream = (ostream *)(psVar1 + 0x10);
  }
  else {
    stream = (ostream *)&std::cout;
  }
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_int)>
              *)&local_50,name_mapper);
  disassemble::InstructionDisassembler::InstructionDisassembler
            (&this->instruction_disassembler_,grammar,stream,options,(NameMapper *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  this->header_ = (options & 0x20) == 0;
  (this->current_function_cfg_).blocks.
  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->current_function_cfg_).blocks.
  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->current_function_cfg_).blocks.
  super__Vector_base<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->byte_offset_ = 0;
  *(undefined4 *)((long)&this->byte_offset_ + 7) = 0;
  return;
}

Assistant:

Disassembler(const AssemblyGrammar& grammar, uint32_t options,
               NameMapper name_mapper)
      : print_(spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_PRINT, options)),
        nested_indent_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NESTED_INDENT, options)),
        reorder_blocks_(
            spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_REORDER_BLOCKS, options)),
        text_(),
        out_(print_ ? out_stream() : out_stream(text_)),
        instruction_disassembler_(grammar, out_.get(), options, name_mapper),
        header_(!spvIsInBitfield(SPV_BINARY_TO_TEXT_OPTION_NO_HEADER, options)),
        byte_offset_(0) {}